

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.h
# Opt level: O0

void __thiscall cmQtAutoGenInitializer::GenVarsT::GenVarsT(GenVarsT *this,GenT gen)

{
  string *psVar1;
  GenT gen_local;
  GenVarsT *this_local;
  
  this->Enabled = false;
  this->Gen = gen;
  psVar1 = cmQtAutoGen::GeneratorNameUpper_abi_cxx11_(gen);
  this->GenNameUpper = psVar1;
  std::__cxx11::string::string((string *)&this->ExecutableTargetName);
  this->ExecutableTarget = (cmGeneratorTarget *)0x0;
  std::__cxx11::string::string((string *)&this->Executable);
  std::shared_ptr<cmQtAutoGen::CompilerFeatures>::shared_ptr(&this->ExecutableFeatures);
  return;
}

Assistant:

GenVarsT(GenT gen)
      : Gen(gen)
      , GenNameUpper(cmQtAutoGen::GeneratorNameUpper(gen)){}